

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticImageProcessing.cpp
# Opt level: O2

void horizontalStrips(int rank)

{
  stripSize = HEIGHT / numberProcesses;
  stripStart = stripSize * rank;
  stripEnd = stripSize + stripStart + -1;
  if ((numberProcesses + -1 == rank) && (HEIGHT % numberProcesses != 0)) {
    stripSize = HEIGHT - stripStart;
    stripEnd = HEIGHT + -1;
  }
  return;
}

Assistant:

void horizontalStrips(int rank) {

    //Now all the processes have the width, height and max colour.
    //What's next is to cut the images into strips.

    //Step 1.  Calculate the strip size.
    stripSize = HEIGHT / numberProcesses;
    //Step 2. define the start and end point of each strip
    stripStart = rank * stripSize;
    stripEnd = stripStart + stripSize - 1;
    //for the last strip to consume all remaining pixels
    if (rank == numberProcesses - 1 && HEIGHT % numberProcesses != 0) {
        stripSize = HEIGHT - stripSize * (numberProcesses - 1);
        stripEnd = HEIGHT - 1;
    }

}